

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

int AF_AActor_GiveSecret
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *actor;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_00452d22;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00452d22;
        }
        goto LAB_00452cd7;
      }
    }
    else if (actor != (AActor *)0x0) goto LAB_00452d12;
    actor = (AActor *)0x0;
LAB_00452cd7:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            P_GiveSecret(actor,param[1].field_0.i != 0,param[2].field_0.i != 0,-1);
            return 0;
          }
          pcVar2 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                      ,0x22f,
                      "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar2 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                  ,0x22e,
                  "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00452d12:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00452d22:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_spec.cpp"
                ,0x22d,
                "int AF_AActor_GiveSecret(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GiveSecret)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL(printmessage);
	PARAM_BOOL(playsound);
	P_GiveSecret(self, printmessage, playsound, -1);
	return 0;
}